

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_or_else(t_parser *this,bool a_assignable)

{
  t_script *ptVar1;
  t_script *ptVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar3;
  t_at at;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_58;
  _Alloc_hider local_50;
  pointer local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = CONCAT71(in_register_00000031,a_assignable);
  f_and_also(this,a_assignable);
  if ((*(char *)(lVar3 + 0x68) == '\0') && (*(int *)(lVar3 + 0x88) == 0x24)) {
    local_50._M_p = (pointer)(lVar3 + 8);
    do {
      local_38 = *(size_type *)(lVar3 + 0x60);
      local_48 = *(pointer *)(lVar3 + 0x50);
      uStack_40 = *(size_type *)(lVar3 + 0x58);
      t_lexer::f_next((t_lexer *)local_50._M_p);
      ptVar2 = (t_script *)operator_new(0x1c0);
      (ptVar2->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
      (ptVar2->v_path)._M_dataplus._M_p = local_48;
      (ptVar2->v_path)._M_string_length = uStack_40;
      (ptVar2->v_path).field_2._M_allocated_capacity = local_38;
      (ptVar2->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_if_0019ad28;
      *(t_script **)((long)&(ptVar2->v_path).field_2 + 8) = this->v_module;
      this->v_module = (t_script *)0x0;
      *(undefined1 *)
       &(ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl
        .super__Deque_impl_data._M_map = 1;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      ptVar2[2].v_mutex.super___mutex_base._M_mutex.__align = 0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      *(undefined8 *)
       ((long)&(ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur + 2) = 0;
      *(undefined8 *)
       ((long)&(ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first + 2) = 0;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      (ptVar2->v_mutex).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(ptVar2->v_mutex).super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(ptVar2->v_mutex).super___mutex_base._M_mutex + 0x10) = 0;
      (ptVar2->v_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (ptVar2->v_mutex).super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      ptVar2[1].super_t_body._vptr_t_body = (_func_int **)0x0;
      ptVar2[1].v_path._M_dataplus._M_p = (pointer)0x0;
      ptVar2[1].v_path._M_string_length = 0;
      ptVar2[1].v_path.field_2._M_allocated_capacity = 0;
      *(undefined2 *)((long)&ptVar2[1].v_path.field_2 + 8) = 0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      ptVar2[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      *(undefined2 *)&ptVar2[1].v_mutex.super___mutex_base._M_mutex = 0;
      *(undefined2 *)
       &ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl
        .super__Deque_impl_data._M_map_size = 0;
      *(undefined8 *)((long)&ptVar2[2].v_path.field_2 + 8) = 0;
      ptVar2[2].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      ptVar2[2].v_path._M_string_length = 0;
      ptVar2[2].v_path.field_2._M_allocated_capacity = 0;
      ptVar2[2].super_t_body._vptr_t_body = (_func_int **)0x0;
      ptVar2[2].v_path._M_dataplus._M_p = (pointer)0x0;
      ptVar2[1].v_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      ptVar2[1].v_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      *(undefined8 *)((long)&ptVar2[1].v_mutex.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&ptVar2[1].v_mutex.super___mutex_base._M_mutex + 0x10) = 0;
      f_and_also((t_parser *)&stack0xffffffffffffffa8,a_assignable);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)&(ptVar2->v_slots).
                     super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &stack0xffffffffffffffa8);
      if ((t_script *)local_58._M_head_impl != (t_script *)0x0) {
        (*((t_body *)&(local_58._M_head_impl)->_vptr_t_node)->_vptr_t_body[1])();
      }
      ptVar1 = this->v_module;
      this->v_module = ptVar2;
      if (ptVar1 != (t_script *)0x0) {
        (*(ptVar1->super_t_body)._vptr_t_body[1])();
      }
    } while ((*(char *)(lVar3 + 0x68) == '\0') && (*(int *)(lVar3 + 0x88) == 0x24));
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_or_else(bool a_assignable)
{
	auto node = f_and_also(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__OR_ELSE) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		auto branch = std::make_unique<ast::t_if>(at, std::move(node), true);
		branch->v_false.push_back(f_and_also(false));
		node = std::move(branch);
	}
	return node;
}